

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall
leveldb::VersionSet::Builder::BySmallestKey::operator()
          (BySmallestKey *this,FileMetaData *f1,FileMetaData *f2)

{
  long lVar1;
  int iVar2;
  InternalKey *in_RDX;
  InternalKey *in_RSI;
  InternalKeyComparator *in_RDI;
  long in_FS_OFFSET;
  int r;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = InternalKeyComparator::Compare(in_RDI,in_RSI,in_RDX);
  if (iVar2 == 0) {
    local_9 = (in_RSI->rep_)._M_string_length < (in_RDX->rep_)._M_string_length;
  }
  else {
    local_9 = iVar2 < 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(FileMetaData* f1, FileMetaData* f2) const {
      int r = internal_comparator->Compare(f1->smallest, f2->smallest);
      if (r != 0) {
        return (r < 0);
      } else {
        // Break ties by file number
        return (f1->number < f2->number);
      }
    }